

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O1

Expression * wasm::toABI(Expression *value,Module *module)

{
  ulong uVar1;
  Expression *right;
  Unary *this;
  Block *this_00;
  ulong uVar2;
  optional<wasm::Type> type;
  Builder local_38;
  Builder builder;
  
  uVar1 = (value->type).id;
  local_38.wasm = module;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  if (6 < (uint)uVar1) {
    return value;
  }
  uVar2 = (long)&switchD_0086ea6e::switchdataD_00df24f0 +
          (long)(int)(&switchD_0086ea6e::switchdataD_00df24f0)[uVar1 & 0xffffffff];
  this_00 = (Block *)value;
  switch(uVar1 & 0xffffffff) {
  case 0:
    right = LiteralUtils::makeZero((Type)0x3,module);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar2;
    this_00 = Builder::makeSequence(&local_38,value,right,type);
    break;
  case 2:
    this_00 = (Block *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    *(undefined4 *)&(this_00->name).super_IString.str._M_len = 0x17;
    goto LAB_0086eb69;
  case 4:
    this = (Unary *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this->op = ReinterpretFloat32;
    this->value = value;
    Unary::finalize(this);
    this_00 = (Block *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    *(undefined4 *)&(this_00->name).super_IString.str._M_len = 0x17;
    (this_00->name).super_IString.str._M_str = (char *)this;
    Unary::finalize((Unary *)this_00);
    break;
  case 5:
    this_00 = (Block *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    *(undefined4 *)&(this_00->name).super_IString.str._M_len = 0x22;
LAB_0086eb69:
    (this_00->name).super_IString.str._M_str = (char *)value;
    Unary::finalize((Unary *)this_00);
    break;
  case 6:
    handle_unreachable("v128 not implemented yet",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/FuncCastEmulation.cpp"
                       ,0x3f);
  }
  return (Expression *)this_00;
}

Assistant:

static Expression* toABI(Expression* value, Module* module) {
  Builder builder(*module);
  switch (value->type.getBasic()) {
    case Type::i32: {
      value = builder.makeUnary(ExtendUInt32, value);
      break;
    }
    case Type::i64: {
      // already good
      break;
    }
    case Type::f32: {
      value = builder.makeUnary(ExtendUInt32,
                                builder.makeUnary(ReinterpretFloat32, value));
      break;
    }
    case Type::f64: {
      value = builder.makeUnary(ReinterpretFloat64, value);
      break;
    }
    case Type::v128: {
      WASM_UNREACHABLE("v128 not implemented yet");
    }
    case Type::none: {
      // the value is none, but we need a value here
      value =
        builder.makeSequence(value, LiteralUtils::makeZero(Type::i64, *module));
      break;
    }
    case Type::unreachable: {
      // can leave it, the call isn't taken anyhow
      break;
    }
  }
  return value;
}